

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_writer.cpp
# Opt level: O0

void __thiscall duckdb::ColumnWriterState::~ColumnWriterState(ColumnWriterState *this)

{
  ColumnWriterState *in_RDI;
  
  ~ColumnWriterState(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

ColumnWriterState::~ColumnWriterState() {
}